

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void GetWin32EscapedString(string *input,string *result)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  size_type sVar3;
  char cVar4;
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/util.cc"
                  ,0x11a,"void GetWin32EscapedString(const string &, string *)");
  }
  uVar2 = 0xffffffffffffffff;
  do {
    if (uVar2 - input->_M_string_length == -1) goto LAB_00173ca3;
    lVar1 = uVar2 + 1;
    uVar2 = uVar2 + 1;
  } while (((input->_M_dataplus)._M_p[lVar1] & 0xfdU) != 0x20);
  if (input->_M_string_length <= uVar2) {
LAB_00173ca3:
    std::__cxx11::string::append((string *)result);
    return;
  }
  std::__cxx11::string::push_back((char)result);
  __first._M_current = (input->_M_dataplus)._M_p;
  sVar3 = input->_M_string_length;
  cVar4 = '\0';
  __last._M_current = __first._M_current;
  do {
    if (sVar3 == 0) {
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)result,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )((input->_M_dataplus)._M_p + input->_M_string_length));
      std::__cxx11::string::append((ulong)result,cVar4);
      std::__cxx11::string::push_back((char)result);
      return;
    }
    if (*__last._M_current == '\"') {
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)result,__first,__last);
      std::__cxx11::string::append((ulong)result,cVar4 + '\x01');
      __first._M_current = __last._M_current;
LAB_00173c98:
      cVar4 = '\0';
    }
    else {
      if (*__last._M_current != '\\') goto LAB_00173c98;
      cVar4 = cVar4 + '\x01';
    }
    __last._M_current = __last._M_current + 1;
    sVar3 = sVar3 - 1;
  } while( true );
}

Assistant:

void GetWin32EscapedString(const string& input, string* result) {
  assert(result);
  if (!StringNeedsWin32Escaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '"';
  const char kBackslash = '\\';

  result->push_back(kQuote);
  size_t consecutive_backslash_count = 0;
  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    switch (*it) {
      case kBackslash:
        ++consecutive_backslash_count;
        break;
      case kQuote:
        result->append(span_begin, it);
        result->append(consecutive_backslash_count + 1, kBackslash);
        span_begin = it;
        consecutive_backslash_count = 0;
        break;
      default:
        consecutive_backslash_count = 0;
        break;
    }
  }
  result->append(span_begin, input.end());
  result->append(consecutive_backslash_count, kBackslash);
  result->push_back(kQuote);
}